

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O1

void __thiscall CLayer::Print(CLayer *this,FILE *pFile,int iMode)

{
  longlong lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined8 in_RAX;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined4 uVar9;
  
  uVar9 = (undefined4)((ulong)in_RAX >> 0x20);
  if (pFile == (FILE *)0x0) {
    return;
  }
  if (iMode < 0x40) {
    if ((iMode != 0) && (iMode != 0x20)) {
LAB_00117285:
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.cpp"
                    ,0x167,"virtual void CLayer::Print(FILE *, int)");
    }
    iVar2 = GetOverFlow(this,0x40);
    uVar3 = GetOverFlow(this,0x400000);
    lVar1 = (this->super_CObject).m_Key;
    iVar4 = IsHorizontal(this);
    uVar5 = 0x48;
    if (iVar4 == 0) {
      uVar5 = 0x56;
    }
    fprintf((FILE *)pFile,"L%d(%c,%d):o(%3d,%3d)\n",(ulong)(uint)lVar1,uVar5,
            (ulong)(uint)this->m_iMaxCapacity,(ulong)uVar3,CONCAT44(uVar9,iVar2));
  }
  else if ((iMode == 0x40) || (iMode == 0x400)) {
    if (0 < this->m_iMaxBX) {
      lVar8 = 0;
      do {
        if (0 < this->m_iMaxBY) {
          lVar6 = 0;
          lVar7 = 0;
          do {
            (**(code **)(*(long *)((long)this->m_ppGrid[lVar8]->m_pAdjGrid + lVar6 + -0x78) + 0x10))
                      ((long)this->m_ppGrid[lVar8]->m_pAdjGrid + lVar6 + -0x78,pFile,iMode);
            lVar7 = lVar7 + 1;
            lVar6 = lVar6 + 0x98;
          } while (lVar7 < this->m_iMaxBY);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < this->m_iMaxBX);
    }
  }
  else {
    if (iMode != 0x800) goto LAB_00117285;
    if (0 < this->m_iMaxBX) {
      lVar8 = 0;
      do {
        if (0 < this->m_iMaxBY) {
          lVar6 = 0;
          lVar7 = 0;
          do {
            (**(code **)(*(long *)((long)this->m_ppGrid[lVar8]->m_pAdjGrid + lVar6 + -0x78) + 0x10))
                      ((long)this->m_ppGrid[lVar8]->m_pAdjGrid + lVar6 + -0x78,pFile,0x800);
            fputc(10,(FILE *)pFile);
            lVar7 = lVar7 + 1;
            lVar6 = lVar6 + 0x98;
          } while (lVar7 < this->m_iMaxBY);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < this->m_iMaxBX);
    }
  }
  fflush((FILE *)pFile);
  return;
}

Assistant:

void CLayer::Print(FILE *pFile, int iMode)
{
	if(pFile==NULL)	return;

	int i,j;
	switch(iMode){
	case PRINT_MODE_CGDUMP:
		for (i=0;i<m_iMaxBX;++i)			
			for (j=0;j<m_iMaxBY;++j)
			{
				GetBoundary(i,j)->Print(pFile,iMode);
				fprintf(pFile,"\n");
			}				
			break;
	case PRINT_MODE_RESULT:
	case PRINT_MODE_OFDUMP:
		for (i=0;i<m_iMaxBX;++i)
			for (j=0;j<m_iMaxBY;++j)
				GetBoundary(i,j)->Print(pFile,iMode);
		break;
	case PRINT_MODE_TEXT:
	case PRINT_MODE_CONGET:
		{	
			int	iMaxOF		=	GetOverFlow(GET_MODE_MAX);
			int	iOverFlow	=	GetOverFlow(GET_MODE_SUM);

			fprintf(pFile,"L%d(%c,%d):o(%3d,%3d)\n",
				Z(),IsHorizontal()? 'H':'V',GetCapacity(GET_MODE_MAX),iOverFlow,iMaxOF);
		}
		break;
	default:
		assert(FALSE);
		break;
	}

	fflush(pFile);
}